

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::IsUnboundedFunction::IsUnboundedFunction(IsUnboundedFunction *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"$isunbounded",&local_31);
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,&local_30,Function);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00476e10;
  return;
}

Assistant:

IsUnboundedFunction() : SystemSubroutine("$isunbounded", SubroutineKind::Function) {}